

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluidSimulation.cpp
# Opt level: O3

void simuFluide2D(string *name,uint64_t Nx,uint64_t Ny,double tSimu,double nu,double rho,
                 double delta,double Lx,double Ly)

{
  int iVar1;
  double *__result;
  ostream *poVar2;
  ulong uVar3;
  complex<double> *pcVar4;
  double *pdVar5;
  char *__function;
  Tensor<std::complex<double>_> *pTVar6;
  double *pdVar7;
  Tensor<std::complex<double>_> *pTVar8;
  Tensor<std::complex<double>_> *pTVar9;
  Tensor<std::complex<double>_> *pTVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  Tensor<std::complex<double>_> *pTVar13;
  long lVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  undefined1 auVar24 [16];
  Matrix<std::complex<double>_> WHat;
  Vector<std::complex<double>_> ky;
  Vector<std::complex<double>_> kx;
  thread saveThread;
  double t;
  Matrix<std::complex<double>_> UxHat;
  Matrix<double> W;
  Matrix<std::complex<double>_> UyHat;
  Matrix<double> Uy;
  Matrix<double> Ux;
  initializer_list<unsigned_long> local_2d8;
  Tensor<std::complex<double>_> *local_2c8;
  undefined8 uStack_2c0;
  Tensor<std::complex<double>_> *local_2b8;
  undefined8 uStack_2b0;
  Tensor<std::complex<double>_> *local_2a0;
  Tensor<std::complex<double>_> *local_298;
  Tensor<std::complex<double>_> *local_290;
  Tensor<std::complex<double>_> local_288;
  Tensor<std::complex<double>_> local_258;
  Tensor<std::complex<double>_> local_228;
  Tensor<std::complex<double>_> *local_1f8;
  double dStack_1f0;
  undefined1 local_1e8 [40];
  double local_1c0;
  Tensor<std::complex<double>_> local_1b8;
  undefined1 local_188 [24];
  Tensor<std::complex<double>_> *local_170;
  complex<double> *local_168;
  double local_160;
  double local_158;
  Tensor<std::complex<double>_> local_150;
  string *local_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  long local_f0;
  double local_e8;
  double local_e0;
  Tensor<std::complex<double>_> local_d8;
  Tensor<std::complex<double>_> *local_a8;
  double dStack_a0;
  Tensor<double> local_90;
  Tensor<double> local_60;
  
  local_288._vptr_Tensor = (_func_int **)0x0;
  local_2b8 = (Tensor<std::complex<double>_> *)rho;
  local_290 = (Tensor<std::complex<double>_> *)delta;
  local_1e8._24_8_ = nu;
  local_120 = name;
  local_f8 = tSimu;
  local_e8 = Ly;
  local_e0 = Lx;
  scp::Matrix<double>::Matrix((Matrix<double> *)&local_60,Ny,Nx,(double *)&local_288);
  local_288._vptr_Tensor = (_func_int **)0x0;
  scp::Matrix<double>::Matrix((Matrix<double> *)&local_90,Ny,Nx,(double *)&local_288);
  local_288._vptr_Tensor = (_func_int **)Ny;
  local_288._shape.order = Nx;
  scp::Tensor<double>::Tensor((Tensor<double> *)&local_150,2,(uint64_t *)&local_288);
  auVar24._8_4_ = (int)(Nx >> 0x20);
  auVar24._0_8_ = Nx;
  auVar24._12_4_ = 0x45300000;
  dStack_1f0 = auVar24._8_8_ - 1.9342813113834067e+25;
  local_1f8 = (Tensor<std::complex<double>_> *)
              (dStack_1f0 + ((double)CONCAT44(0x43300000,(int)Nx) - 4503599627370496.0));
  auVar16._8_4_ = (int)(Ny >> 0x20);
  auVar16._0_8_ = Ny;
  auVar16._12_4_ = 0x45300000;
  dStack_a0 = auVar16._8_8_ - 1.9342813113834067e+25;
  local_a8 = (Tensor<std::complex<double>_> *)
             (dStack_a0 + ((double)CONCAT44(0x43300000,(int)Ny) - 4503599627370496.0));
  local_150._vptr_Tensor = (_func_int **)&PTR__Tensor_00110c30;
  if (Ny != 0) {
    local_290 = (Tensor<std::complex<double>_> *)((double)local_290 * 6.283185307179586);
    lVar14 = 0;
    uVar11 = 0;
    do {
      if (Nx != 0) {
        auVar17._8_4_ = (int)(uVar11 >> 0x20);
        auVar17._0_8_ = uVar11;
        auVar17._12_4_ = 0x45300000;
        dStack_110 = auVar17._8_8_ - 1.9342813113834067e+25;
        local_108 = (dStack_110 + ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0) +
                    0.5) / (double)local_a8;
        local_118 = (local_108 + -0.25) * (double)local_2b8;
        local_2a0 = (Tensor<std::complex<double>_> *)((0.75 - local_108) * (double)local_2b8);
        uVar12 = 0;
        dStack_100 = dStack_110;
        do {
          auVar20._8_4_ = (int)(uVar12 >> 0x20);
          auVar20._0_8_ = uVar12;
          auVar20._12_4_ = 0x45300000;
          dVar15 = cos((((auVar20._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0) + 0.5) /
                       (double)local_1f8) * 6.283185307179586);
          local_2c8 = (Tensor<std::complex<double>_> *)(dVar15 * (double)local_290);
          if (local_108 <= 0.5) {
            local_298 = (Tensor<std::complex<double>_> *)cosh(local_118);
            dVar15 = cosh(local_118);
            dVar15 = (double)local_2c8 - (double)local_2b8 / (dVar15 * (double)local_298);
          }
          else {
            local_298 = (Tensor<std::complex<double>_> *)cosh((double)local_2a0);
            dVar15 = cosh((double)local_2a0);
            dVar15 = (double)local_2c8 + (double)local_2b8 / (dVar15 * (double)local_298);
          }
          if (local_150._length <= lVar14 + uVar12) goto LAB_00107cb4;
          *(double *)((local_150._values)->_M_value + (lVar14 + uVar12) * 8) = dVar15;
          uVar12 = uVar12 + 1;
        } while (Nx != uVar12);
        lVar14 = lVar14 + uVar12;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != Ny);
  }
  local_1c0 = 0.0;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&local_288,local_120,auto_format);
  simanim::createAnimation((path *)&local_288,Nx,Ny);
  std::filesystem::__cxx11::path::~path((path *)&local_288);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&local_288,local_120,auto_format);
  local_228._vptr_Tensor = (_func_int **)&local_150;
  std::thread::
  thread<void(&)(std::filesystem::__cxx11::path_const&,double,scp::Matrix<double>const&),std::filesystem::__cxx11::path,double&,std::reference_wrapper<scp::Matrix<double>>,void>
            ((thread *)(local_1e8 + 0x20),simanim::saveAnimationFrame,(path *)&local_288,&local_1c0,
             (reference_wrapper<scp::Matrix<double>_> *)&local_228);
  std::filesystem::__cxx11::path::~path((path *)&local_288);
  if (local_1c0 < local_f8) {
    local_108 = local_e0 / (double)local_1f8;
    local_118 = local_e8 / (double)local_a8;
    local_1e8._24_8_ = (double)local_1e8._24_8_ / (double)local_2b8;
    local_168 = (complex<double> *)((double)local_1e8._24_8_ + (double)local_1e8._24_8_);
    local_158 = local_108 * local_108;
    local_160 = local_118 * local_118;
    local_f0 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"> Iteration ",0xc);
      local_f0 = local_f0 + 1;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," a t=",5);
      poVar2 = std::ostream::_M_insert<double>(local_1c0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if (local_150._shape.order < 2) {
LAB_00107cea:
        __assert_fail("i < _shape.order",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Reiex[P]SciPP/include/SciPP/Core/templates/Tensor.hpp"
                      ,0x37d,
                      "uint64_t scp::Tensor<double>::getSize(uint64_t) const [TValue = double]");
      }
      pTVar13 = (Tensor<std::complex<double>_> *)*local_150._shape.sizes;
      pTVar9 = (Tensor<std::complex<double>_> *)local_150._shape.sizes[1];
      local_228._vptr_Tensor = (_func_int **)pTVar13;
      local_228._shape.order = (uint64_t)pTVar9;
      scp::Tensor<std::complex<double>_>::Tensor(&local_288,2,(uint64_t *)&local_228);
      local_288._vptr_Tensor = (_func_int **)&PTR__Tensor_00110c98;
      if (0 < (long)local_150._length) {
        uVar3 = local_150._length + 1;
        lVar14 = 0;
        do {
          *(undefined8 *)((local_288._values)->_M_value + lVar14 * 2) =
               *(undefined8 *)((local_150._values)->_M_value + lVar14);
          *(undefined8 *)((local_288._values)->_M_value + 8 + lVar14 * 2) = 0;
          uVar3 = uVar3 - 1;
          lVar14 = lVar14 + 8;
        } while (1 < uVar3);
      }
      scp::Tensor<std::complex<double>_>::fft(&local_288);
      local_258._vptr_Tensor = (_func_int **)pTVar9;
      scp::Tensor<std::complex<double>_>::Tensor(&local_228,1,(uint64_t *)&local_258);
      local_228._vptr_Tensor = (_func_int **)&PTR__Tensor_00110d00;
      local_1b8._vptr_Tensor = (_func_int **)pTVar13;
      scp::Tensor<std::complex<double>_>::Tensor(&local_258,1,(uint64_t *)&local_1b8);
      local_258._vptr_Tensor = (_func_int **)&PTR__Tensor_00110d00;
      uVar21 = SUB164(ZEXT816(0x4530000043300000),0);
      uVar22 = SUB164(ZEXT816(0x4530000043300000),4);
      if (pTVar9 != (Tensor<std::complex<double>_> *)0x0) {
        lVar14 = 8;
        pTVar6 = (Tensor<std::complex<double>_> *)0x0;
        do {
          if (pTVar6 < (Tensor<std::complex<double>_> *)
                       ((ulong)((long)&pTVar9->_vptr_Tensor + 1U) >> 1)) {
            pTVar10 = pTVar6;
            if (local_228._length <= pTVar6) goto LAB_00107ccb;
          }
          else {
            if (local_228._length <= pTVar6) goto LAB_00107ccb;
            pTVar10 = (Tensor<std::complex<double>_> *)((long)pTVar9 - (long)pTVar6);
          }
          auVar18._8_4_ = (int)((ulong)pTVar10 >> 0x20);
          auVar18._0_8_ = pTVar10;
          auVar18._12_4_ = uVar22;
          *(undefined8 *)((local_228._values)->_M_value + lVar14 + -8) = 0;
          *(double *)((local_228._values)->_M_value + lVar14) =
               (((auVar18._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(uVar21,(int)pTVar10) - 4503599627370496.0)) * 6.283185307179586) /
               local_e0;
          pTVar6 = (Tensor<std::complex<double>_> *)((long)&pTVar6->_vptr_Tensor + 1);
          lVar14 = lVar14 + 0x10;
        } while (pTVar9 != pTVar6);
      }
      if (pTVar13 != (Tensor<std::complex<double>_> *)0x0) {
        lVar14 = 8;
        pTVar6 = (Tensor<std::complex<double>_> *)0x0;
        do {
          if (pTVar6 < (Tensor<std::complex<double>_> *)
                       ((ulong)((long)&pTVar13->_vptr_Tensor + 1U) >> 1)) {
            pTVar10 = pTVar6;
            if (local_258._length <= pTVar6) goto LAB_00107ccb;
          }
          else {
            if (local_258._length <= pTVar6) goto LAB_00107ccb;
            pTVar10 = (Tensor<std::complex<double>_> *)((long)pTVar13 - (long)pTVar6);
          }
          auVar19._8_4_ = (int)((ulong)pTVar10 >> 0x20);
          auVar19._0_8_ = pTVar10;
          auVar19._12_4_ = uVar22;
          *(undefined8 *)((local_258._values)->_M_value + lVar14 + -8) = 0;
          *(double *)((local_258._values)->_M_value + lVar14) =
               (((auVar19._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(uVar21,(int)pTVar10) - 4503599627370496.0)) * 6.283185307179586) /
               local_e8;
          pTVar6 = (Tensor<std::complex<double>_> *)((long)&pTVar6->_vptr_Tensor + 1);
          lVar14 = lVar14 + 0x10;
        } while (pTVar13 != pTVar6);
      }
      local_d8._vptr_Tensor = (_func_int **)pTVar13;
      local_d8._shape.order = (uint64_t)pTVar9;
      scp::Tensor<std::complex<double>_>::Tensor(&local_1b8,2,(uint64_t *)&local_d8);
      local_1b8._vptr_Tensor = (_func_int **)&PTR__Tensor_00110c98;
      local_2d8._M_array = (iterator)pTVar13;
      local_2d8._M_len = (size_type)pTVar9;
      scp::Tensor<std::complex<double>_>::Tensor(&local_d8,2,(uint64_t *)&local_2d8);
      local_d8._vptr_Tensor = (_func_int **)&PTR__Tensor_00110c98;
      local_2c8 = pTVar9;
      if (pTVar13 != (Tensor<std::complex<double>_> *)0x0) {
        pTVar6 = (Tensor<std::complex<double>_> *)0x0;
        do {
          if (pTVar9 != (Tensor<std::complex<double>_> *)0x0) {
            lVar14 = 0;
            pTVar10 = (Tensor<std::complex<double>_> *)0x0;
            do {
              if (pTVar10 == (Tensor<std::complex<double>_> *)0x0 &&
                  pTVar6 == (Tensor<std::complex<double>_> *)0x0) {
                local_1e8._0_8_ = (_func_int **)0x0;
                local_1e8._8_8_ = 0;
                local_2d8._M_len = 2;
                local_2d8._M_array = (iterator)local_1e8;
                pcVar4 = scp::Tensor<std::complex<double>_>::operator[](&local_1b8,&local_2d8);
                *(undefined8 *)pcVar4->_M_value = 0;
                *(undefined8 *)(pcVar4->_M_value + 8) = 0;
                local_1e8._0_8_ = (Tensor<std::complex<double>_> *)0x0;
                local_1e8._8_8_ = (Tensor<std::complex<double>_> *)0x0;
                local_2d8._M_len = 2;
                local_2d8._M_array = (iterator)local_1e8;
                pcVar4 = scp::Tensor<std::complex<double>_>::operator[](&local_d8,&local_2d8);
                *(undefined8 *)pcVar4->_M_value = 0;
                *(undefined8 *)(pcVar4->_M_value + 8) = 0;
              }
              else {
                local_1e8._0_8_ = local_188 + 0x10;
                local_1e8._8_8_ = (Tensor<std::complex<double>_> *)0x2;
                local_188._16_8_ = pTVar6;
                local_170 = pTVar10;
                pcVar4 = scp::Tensor<std::complex<double>_>::operator[]
                                   (&local_288,(initializer_list<unsigned_long> *)local_1e8);
                if (local_258._length <= pTVar6) goto LAB_00107ccb;
                local_2d8._M_array =
                     (iterator)((ulong)*(double *)pcVar4->_M_value ^ 0x8000000000000000);
                local_2d8._M_len = (ulong)*(double *)(pcVar4->_M_value + 8) ^ 0x8000000000000000;
                std::complex<double>::operator*=
                          ((complex<double> *)&local_2d8,local_258._values + (long)pTVar6);
                if (local_228._length <= pTVar10) goto LAB_00107ccb;
                local_2b8 = (Tensor<std::complex<double>_> *)local_2d8._M_array;
                local_2a0 = (Tensor<std::complex<double>_> *)local_2d8._M_len;
                local_2d8._M_array = *(iterator *)((local_228._values)->_M_value + lVar14);
                local_2d8._M_len =
                     *(size_type *)((long)((local_228._values)->_M_value + lVar14) + 8);
                std::complex<double>::operator*=
                          ((complex<double> *)&local_2d8,
                           (complex<double> *)((local_228._values)->_M_value + lVar14));
                if (local_258._length <= pTVar6) goto LAB_00107ccb;
                local_1f8 = (Tensor<std::complex<double>_> *)local_2d8._M_array;
                local_290 = (Tensor<std::complex<double>_> *)local_2d8._M_len;
                local_2d8._M_array = *(iterator *)local_258._values[(long)pTVar6]._M_value;
                local_2d8._M_len = *(size_type *)(local_258._values[(long)pTVar6]._M_value + 8);
                std::complex<double>::operator*=
                          ((complex<double> *)&local_2d8,local_258._values + (long)pTVar6);
                auVar24 = __divdc3(local_2b8,local_2a0,
                                   (double)local_1f8 + (double)local_2d8._M_array,
                                   (double)local_290 + (double)local_2d8._M_len);
                local_2a0 = auVar24._8_8_;
                local_2b8 = auVar24._0_8_;
                local_2d8._M_array = (iterator)local_188;
                local_2d8._M_len = 2;
                local_188._0_8_ = pTVar6;
                local_188._8_8_ = pTVar10;
                pcVar4 = scp::Tensor<std::complex<double>_>::operator[](&local_1b8,&local_2d8);
                *(Tensor<std::complex<double>_> **)pcVar4->_M_value = local_2b8;
                *(Tensor<std::complex<double>_> **)(pcVar4->_M_value + 8) = local_2a0;
                local_1e8._0_8_ = local_188 + 0x10;
                local_1e8._8_8_ = (Tensor<std::complex<double>_> *)0x2;
                local_188._16_8_ = pTVar6;
                local_170 = pTVar10;
                pcVar4 = scp::Tensor<std::complex<double>_>::operator[]
                                   (&local_288,(initializer_list<unsigned_long> *)local_1e8);
                if (local_228._length <= pTVar10) goto LAB_00107ccb;
                local_2d8._M_array = *(iterator *)pcVar4->_M_value;
                local_2d8._M_len = *(size_type *)(pcVar4->_M_value + 8);
                std::complex<double>::operator*=
                          ((complex<double> *)&local_2d8,
                           (complex<double> *)((local_228._values)->_M_value + lVar14));
                if (local_228._length <= pTVar10) goto LAB_00107ccb;
                local_2b8 = (Tensor<std::complex<double>_> *)local_2d8._M_array;
                local_2a0 = (Tensor<std::complex<double>_> *)local_2d8._M_len;
                local_2d8._M_array = *(iterator *)((local_228._values)->_M_value + lVar14);
                local_2d8._M_len =
                     *(size_type *)((long)((local_228._values)->_M_value + lVar14) + 8);
                std::complex<double>::operator*=
                          ((complex<double> *)&local_2d8,
                           (complex<double> *)((local_228._values)->_M_value + lVar14));
                if (local_258._length <= pTVar6) goto LAB_00107ccb;
                local_1f8 = (Tensor<std::complex<double>_> *)local_2d8._M_array;
                local_290 = (Tensor<std::complex<double>_> *)local_2d8._M_len;
                local_2d8._M_array = *(iterator *)local_258._values[(long)pTVar6]._M_value;
                local_2d8._M_len = *(size_type *)(local_258._values[(long)pTVar6]._M_value + 8);
                std::complex<double>::operator*=
                          ((complex<double> *)&local_2d8,local_258._values + (long)pTVar6);
                auVar24 = __divdc3(local_2b8,local_2a0,
                                   (double)local_1f8 + (double)local_2d8._M_array,
                                   (double)local_290 + (double)local_2d8._M_len);
                local_2a0 = auVar24._8_8_;
                local_2b8 = auVar24._0_8_;
                local_2d8._M_array = (iterator)local_188;
                local_2d8._M_len = 2;
                local_188._0_8_ = pTVar6;
                local_188._8_8_ = pTVar10;
                pcVar4 = scp::Tensor<std::complex<double>_>::operator[](&local_d8,&local_2d8);
                *(Tensor<std::complex<double>_> **)pcVar4->_M_value = local_2b8;
                *(Tensor<std::complex<double>_> **)(pcVar4->_M_value + 8) = local_2a0;
              }
              pTVar10 = (Tensor<std::complex<double>_> *)((long)&pTVar10->_vptr_Tensor + 1);
              lVar14 = lVar14 + 0x10;
              pTVar9 = local_2c8;
            } while (local_2c8 != pTVar10);
          }
          pTVar6 = (Tensor<std::complex<double>_> *)((long)&pTVar6->_vptr_Tensor + 1);
        } while (pTVar6 != pTVar13);
      }
      scp::Tensor<std::complex<double>_>::ifft(&local_1b8);
      scp::Tensor<std::complex<double>_>::ifft(&local_d8);
      if (pTVar13 != (Tensor<std::complex<double>_> *)0x0) {
        pTVar6 = (Tensor<std::complex<double>_> *)0x0;
        local_298 = pTVar13;
        do {
          if (pTVar9 != (Tensor<std::complex<double>_> *)0x0) {
            pTVar13 = (Tensor<std::complex<double>_> *)0x0;
            do {
              local_2d8._M_len = 2;
              local_2d8._M_array = (iterator)local_1e8;
              local_1e8._0_8_ = pTVar6;
              local_1e8._8_8_ = pTVar13;
              pcVar4 = scp::Tensor<std::complex<double>_>::operator[](&local_1b8,&local_2d8);
              local_2b8 = *(Tensor<std::complex<double>_> **)(pcVar4->_M_value + 8);
              local_170 = (Tensor<std::complex<double>_> *)0x2;
              local_188._0_8_ = pTVar6;
              local_188._8_8_ = pTVar13;
              local_188._16_8_ = (Tensor<std::complex<double>_> *)local_188;
              pdVar5 = scp::Tensor<double>::operator[]
                                 (&local_60,(initializer_list<unsigned_long> *)(local_188 + 0x10));
              *pdVar5 = (double)local_2b8;
              local_2d8._M_len = 2;
              local_2d8._M_array = (iterator)local_1e8;
              local_1e8._0_8_ = pTVar6;
              local_1e8._8_8_ = pTVar13;
              pcVar4 = scp::Tensor<std::complex<double>_>::operator[](&local_d8,&local_2d8);
              local_2b8 = *(Tensor<std::complex<double>_> **)(pcVar4->_M_value + 8);
              local_170 = (Tensor<std::complex<double>_> *)0x2;
              local_188._0_8_ = pTVar6;
              local_188._8_8_ = pTVar13;
              local_188._16_8_ = (Tensor<std::complex<double>_> *)local_188;
              pdVar5 = scp::Tensor<double>::operator[]
                                 (&local_90,(initializer_list<unsigned_long> *)(local_188 + 0x10));
              *pdVar5 = (double)local_2b8;
              pTVar13 = (Tensor<std::complex<double>_> *)((long)&pTVar13->_vptr_Tensor + 1);
              pTVar9 = local_2c8;
            } while (local_2c8 != pTVar13);
          }
          pTVar6 = (Tensor<std::complex<double>_> *)((long)&pTVar6->_vptr_Tensor + 1);
        } while (pTVar6 != local_298);
      }
      scp::Tensor<std::complex<double>_>::~Tensor(&local_d8);
      scp::Tensor<std::complex<double>_>::~Tensor(&local_1b8);
      scp::Tensor<std::complex<double>_>::~Tensor(&local_258);
      scp::Tensor<std::complex<double>_>::~Tensor(&local_228);
      scp::Tensor<std::complex<double>_>::~Tensor(&local_288);
      pdVar5 = local_60._values;
      if (1 < local_60._length) {
        dVar15 = *local_60._values;
        lVar14 = local_60._length * 8 + -8;
        pdVar7 = local_60._values;
        do {
          pdVar7 = pdVar7 + 1;
          dVar23 = ABS(*pdVar7);
          uVar3 = -(ulong)(ABS(dVar15) < dVar23);
          if (ABS(dVar15) < dVar23) {
            pdVar5 = pdVar7;
          }
          dVar15 = (double)(~uVar3 & (ulong)dVar15 | (ulong)*pdVar7 & uVar3);
          lVar14 = lVar14 + -8;
        } while (lVar14 != 0);
      }
      local_2c8 = (Tensor<std::complex<double>_> *)*pdVar5;
      uStack_2c0 = 0;
      pdVar5 = local_90._values;
      if (1 < local_90._length) {
        dVar15 = *local_90._values;
        lVar14 = local_90._length * 8 + -8;
        pdVar7 = local_90._values;
        do {
          pdVar7 = pdVar7 + 1;
          dVar23 = ABS(*pdVar7);
          uVar3 = -(ulong)(ABS(dVar15) < dVar23);
          if (ABS(dVar15) < dVar23) {
            pdVar5 = pdVar7;
          }
          dVar15 = (double)(~uVar3 & (ulong)dVar15 | (ulong)*pdVar7 & uVar3);
          lVar14 = lVar14 + -8;
        } while (lVar14 != 0);
      }
      local_2b8 = (Tensor<std::complex<double>_> *)*pdVar5;
      uStack_2b0 = 0;
      std::thread::join();
      if (local_150._shape.order < 2) goto LAB_00107cea;
      pTVar13 = (Tensor<std::complex<double>_> *)*local_150._shape.sizes;
      pTVar9 = (Tensor<std::complex<double>_> *)local_150._shape.sizes[1];
      local_298 = pTVar9;
      local_1f8 = pTVar13;
      if (((anonymous_namespace)::
           curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
           ::Kx == '\0') &&
         (iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::
                                       curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                       ::Kx), iVar1 != 0)) {
        local_288._vptr_Tensor = (_func_int **)0x0;
        scp::Matrix<double>::Matrix
                  ((Matrix<double> *)
                   (anonymous_namespace)::
                   curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                   ::Kx,(uint64_t)pTVar9,(uint64_t)pTVar9,(double *)&local_288);
        __cxa_atexit(scp::Tensor<double>::~Tensor,
                     (anonymous_namespace)::
                     curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                     ::Kx,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::
                             curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                             ::Kx);
        pTVar13 = local_1f8;
      }
      if (((anonymous_namespace)::
           curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
           ::Ky == '\0') &&
         (iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::
                                       curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                       ::Ky), iVar1 != 0)) {
        local_288._vptr_Tensor = (_func_int **)0x0;
        scp::Matrix<double>::Matrix
                  ((Matrix<double> *)
                   (anonymous_namespace)::
                   curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                   ::Ky,(uint64_t)pTVar13,(uint64_t)pTVar13,(double *)&local_288);
        __cxa_atexit(scp::Tensor<double>::~Tensor,
                     (anonymous_namespace)::
                     curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                     ::Ky,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::
                             curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                             ::Ky);
        pTVar13 = local_1f8;
      }
      pTVar9 = local_298;
      dVar15 = local_118 / ABS((double)local_2b8);
      if (local_108 / ABS((double)local_2c8) <= local_118 / ABS((double)local_2b8)) {
        dVar15 = local_108 / ABS((double)local_2c8);
      }
      if (dVar15 <= (double)(anonymous_namespace)::
                            curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                            ::dtUsed * 1.2) {
        if (dVar15 < (double)(anonymous_namespace)::
                             curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                             ::dtUsed) {
          do {
            (anonymous_namespace)::
            curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
            ::dtUsed = (Tensor<std::complex<double>_> *)
                       ((double)(anonymous_namespace)::
                                curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                ::dtUsed / 1.2);
          } while (dVar15 < (double)(anonymous_namespace)::
                                    curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                    ::dtUsed);
          goto LAB_00106ffd;
        }
      }
      else {
        (anonymous_namespace)::
        curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
        ::dtUsed = (Tensor<std::complex<double>_> *)
                   (~-(ulong)((double)(anonymous_namespace)::
                                      curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                      ::dtUsed == 0.0) &
                    (ulong)((double)(anonymous_namespace)::
                                    curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                    ::dtUsed * 1.2) |
                   (ulong)dVar15 &
                   -(ulong)((double)(anonymous_namespace)::
                                    curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                    ::dtUsed == 0.0));
LAB_00106ffd:
        if (local_298 != (Tensor<std::complex<double>_> *)0x0) {
          local_2b8 = (Tensor<std::complex<double>_> *)&local_298[-1].field_0x2f;
          pTVar13 = (Tensor<std::complex<double>_> *)0x0;
          do {
            local_2c8 = (Tensor<std::complex<double>_> *)
                        (((double)(anonymous_namespace)::
                                  curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                  ::dtUsed * (double)local_168) / local_158 + 1.0);
            local_288._shape.order = 2;
            local_288._vptr_Tensor = (_func_int **)&local_228;
            local_228._vptr_Tensor = (_func_int **)pTVar13;
            local_228._shape.order = (uint64_t)pTVar13;
            pdVar5 = scp::Tensor<double>::operator[]
                               ((Tensor<double> *)
                                (anonymous_namespace)::
                                curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                ::Kx,(initializer_list<unsigned_long> *)&local_288);
            *pdVar5 = (double)local_2c8;
            local_2c8 = (Tensor<std::complex<double>_> *)
                        ((-(double)(anonymous_namespace)::
                                   curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                   ::dtUsed * (double)local_1e8._24_8_) / local_158);
            uStack_2c0 = 0x8000000000000000;
            pTVar6 = (Tensor<std::complex<double>_> *)((long)&pTVar13->_vptr_Tensor + 1);
            pTVar10 = (Tensor<std::complex<double>_> *)0x0;
            if (local_2b8 != pTVar13) {
              pTVar10 = pTVar6;
            }
            local_288._shape.order = 2;
            local_288._vptr_Tensor = (_func_int **)&local_228;
            local_228._vptr_Tensor = (_func_int **)pTVar10;
            local_228._shape.order = (uint64_t)pTVar13;
            pdVar5 = scp::Tensor<double>::operator[]
                               ((Tensor<double> *)
                                (anonymous_namespace)::
                                curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                ::Kx,(initializer_list<unsigned_long> *)&local_288);
            *pdVar5 = (double)local_2c8;
            local_2c8 = (Tensor<std::complex<double>_> *)
                        ((-(double)(anonymous_namespace)::
                                   curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                   ::dtUsed * (double)local_1e8._24_8_) / local_158);
            uStack_2c0 = 0x8000000000000000;
            local_288._shape.order = 2;
            local_288._vptr_Tensor = (_func_int **)&local_228;
            local_228._vptr_Tensor = (_func_int **)pTVar13;
            local_228._shape.order = (uint64_t)pTVar10;
            pdVar5 = scp::Tensor<double>::operator[]
                               ((Tensor<double> *)
                                (anonymous_namespace)::
                                curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                ::Kx,(initializer_list<unsigned_long> *)&local_288);
            *pdVar5 = (double)local_2c8;
            pTVar13 = pTVar6;
          } while (pTVar9 != pTVar6);
        }
        scp::Matrix<double>::inverse
                  ((Matrix<double> *)
                   (anonymous_namespace)::
                   curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                   ::Kx);
        pTVar13 = local_1f8;
        if (local_1f8 != (Tensor<std::complex<double>_> *)0x0) {
          local_2b8 = (Tensor<std::complex<double>_> *)&local_1f8[-1].field_0x2f;
          pTVar9 = (Tensor<std::complex<double>_> *)0x0;
          do {
            local_2c8 = (Tensor<std::complex<double>_> *)
                        (((double)(anonymous_namespace)::
                                  curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                  ::dtUsed * (double)local_168) / local_160 + 1.0);
            local_288._shape.order = 2;
            local_288._vptr_Tensor = (_func_int **)&local_228;
            local_228._vptr_Tensor = (_func_int **)pTVar9;
            local_228._shape.order = (uint64_t)pTVar9;
            pdVar5 = scp::Tensor<double>::operator[]
                               ((Tensor<double> *)
                                (anonymous_namespace)::
                                curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                ::Ky,(initializer_list<unsigned_long> *)&local_288);
            *pdVar5 = (double)local_2c8;
            local_2c8 = (Tensor<std::complex<double>_> *)
                        ((-(double)(anonymous_namespace)::
                                   curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                   ::dtUsed * (double)local_1e8._24_8_) / local_160);
            uStack_2c0 = 0x8000000000000000;
            pTVar6 = (Tensor<std::complex<double>_> *)((long)&pTVar9->_vptr_Tensor + 1);
            pTVar10 = (Tensor<std::complex<double>_> *)0x0;
            if (local_2b8 != pTVar9) {
              pTVar10 = pTVar6;
            }
            local_288._shape.order = 2;
            local_288._vptr_Tensor = (_func_int **)&local_228;
            local_228._vptr_Tensor = (_func_int **)pTVar10;
            local_228._shape.order = (uint64_t)pTVar9;
            pdVar5 = scp::Tensor<double>::operator[]
                               ((Tensor<double> *)
                                (anonymous_namespace)::
                                curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                ::Ky,(initializer_list<unsigned_long> *)&local_288);
            pTVar13 = local_1f8;
            *pdVar5 = (double)local_2c8;
            local_2c8 = (Tensor<std::complex<double>_> *)
                        ((-(double)(anonymous_namespace)::
                                   curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                   ::dtUsed * (double)local_1e8._24_8_) / local_160);
            uStack_2c0 = 0x8000000000000000;
            local_288._shape.order = 2;
            local_288._vptr_Tensor = (_func_int **)&local_228;
            local_228._vptr_Tensor = (_func_int **)pTVar9;
            local_228._shape.order = (uint64_t)pTVar10;
            pdVar5 = scp::Tensor<double>::operator[]
                               ((Tensor<double> *)
                                (anonymous_namespace)::
                                curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                                ::Ky,(initializer_list<unsigned_long> *)&local_288);
            *pdVar5 = (double)local_2c8;
            pTVar9 = pTVar6;
          } while (pTVar13 != pTVar6);
        }
        scp::Matrix<double>::inverse
                  ((Matrix<double> *)
                   (anonymous_namespace)::
                   curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                   ::Ky);
      }
      local_228._vptr_Tensor = (_func_int **)local_298;
      scp::Tensor<double>::Tensor((Tensor<double> *)&local_288,1,(uint64_t *)&local_228);
      local_288._vptr_Tensor = (_func_int **)&PTR__Tensor_00110d38;
      local_258._vptr_Tensor = (_func_int **)local_298;
      scp::Tensor<double>::Tensor((Tensor<double> *)&local_228,1,(uint64_t *)&local_258);
      local_228._vptr_Tensor = (_func_int **)&PTR__Tensor_00110d38;
      if (pTVar13 != (Tensor<std::complex<double>_> *)0x0) {
        local_a8 = (Tensor<std::complex<double>_> *)&local_298[-1].field_0x2f;
        pTVar6 = (Tensor<std::complex<double>_> *)0x0;
        pTVar9 = local_298;
        do {
          if (pTVar9 != (Tensor<std::complex<double>_> *)0x0) {
            pTVar13 = (Tensor<std::complex<double>_> *)0x0;
            do {
              local_258._shape.order = 2;
              local_258._vptr_Tensor = (_func_int **)&local_1b8;
              local_1b8._vptr_Tensor = (_func_int **)pTVar6;
              local_1b8._shape.order = (uint64_t)pTVar13;
              pdVar5 = scp::Tensor<double>::operator[]
                                 (&local_60,(initializer_list<unsigned_long> *)&local_258);
              local_2c8 = (Tensor<std::complex<double>_> *)*pdVar5;
              local_2b8 = (anonymous_namespace)::
                          curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                          ::dtUsed;
              local_258._shape.order = 2;
              local_258._vptr_Tensor = (_func_int **)&local_1b8;
              local_1b8._vptr_Tensor = (_func_int **)pTVar6;
              local_1b8._shape.order = (uint64_t)pTVar13;
              pdVar5 = scp::Tensor<double>::operator[]
                                 ((Tensor<double> *)&local_150,
                                  (initializer_list<unsigned_long> *)&local_258);
              local_2a0 = (Tensor<std::complex<double>_> *)*pdVar5;
              pTVar10 = (Tensor<std::complex<double>_> *)((long)&pTVar13->_vptr_Tensor + 1);
              local_2d8._M_len = (size_type)(Tensor<std::complex<double>_> *)0x0;
              if (local_a8 != pTVar13) {
                local_2d8._M_len = (size_type)pTVar10;
              }
              local_d8._shape.order = 2;
              local_2d8._M_array = (iterator)pTVar6;
              local_d8._vptr_Tensor = (_func_int **)&local_2d8;
              pdVar5 = scp::Tensor<double>::operator[]
                                 ((Tensor<double> *)&local_150,
                                  (initializer_list<unsigned_long> *)&local_d8);
              pTVar9 = local_298;
              if (local_288._length <= pTVar13) goto LAB_00107cb4;
              dVar15 = ((double)local_2c8 * (double)local_2b8) / local_108;
              *(double *)((local_288._values)->_M_value + (long)pTVar13 * 8) =
                   (dVar15 + -1.0) * dVar15 * 0.5 * *pdVar5 +
                   (1.0 - dVar15 * dVar15) * (double)local_2a0;
              pTVar8 = (Tensor<std::complex<double>_> *)
                       ((ulong)(&local_298[-1].field_0x2f + (long)&pTVar13->_vptr_Tensor) %
                       (ulong)local_298);
              local_258._shape.order = 2;
              local_290 = pTVar10;
              local_258._vptr_Tensor = (_func_int **)&local_1b8;
              local_1b8._vptr_Tensor = (_func_int **)pTVar6;
              local_1b8._shape.order = (uint64_t)pTVar8;
              pdVar5 = scp::Tensor<double>::operator[]
                                 (&local_60,(initializer_list<unsigned_long> *)&local_258);
              local_2c8 = (Tensor<std::complex<double>_> *)*pdVar5;
              local_2b8 = (anonymous_namespace)::
                          curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                          ::dtUsed;
              local_258._shape.order = 2;
              local_258._vptr_Tensor = (_func_int **)&local_1b8;
              local_1b8._vptr_Tensor = (_func_int **)pTVar6;
              local_1b8._shape.order = (uint64_t)pTVar8;
              pdVar5 = scp::Tensor<double>::operator[]
                                 ((Tensor<double> *)&local_150,
                                  (initializer_list<unsigned_long> *)&local_258);
              if (local_288._length <= pTVar13) goto LAB_00107cb4;
              dVar15 = ((double)local_2c8 * (double)local_2b8) / local_108;
              *(double *)((local_288._values)->_M_value + (long)pTVar13 * 8) =
                   (dVar15 + 1.0) * dVar15 * 0.5 * *pdVar5 +
                   *(double *)((local_288._values)->_M_value + (long)pTVar13 * 8);
              pTVar13 = local_290;
            } while (pTVar9 != local_290);
          }
          scp::operator*((Vector<double> *)&local_258,
                         (Matrix<double> *)
                         (anonymous_namespace)::
                         curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                         ::Kx,(Vector<double> *)&local_288);
          scp::Tensor<double>::operator=((Tensor<double> *)&local_288,(Tensor<double> *)&local_258);
          scp::Tensor<double>::~Tensor((Tensor<double> *)&local_258);
          pTVar13 = local_1f8;
          if (pTVar9 != (Tensor<std::complex<double>_> *)0x0) {
            pTVar10 = (Tensor<std::complex<double>_> *)0x0;
            do {
              if (local_288._length <= pTVar10) goto LAB_00107cb4;
              local_2c8 = *(Tensor<std::complex<double>_> **)
                           ((local_288._values)->_M_value + (long)pTVar10 * 8);
              local_258._vptr_Tensor = (_func_int **)&local_1b8;
              local_258._shape.order = 2;
              local_1b8._vptr_Tensor = (_func_int **)pTVar6;
              local_1b8._shape.order = (uint64_t)pTVar10;
              pdVar5 = scp::Tensor<double>::operator[]
                                 ((Tensor<double> *)&local_150,
                                  (initializer_list<unsigned_long> *)&local_258);
              *pdVar5 = (double)local_2c8;
              pTVar10 = (Tensor<std::complex<double>_> *)((long)&pTVar10->_vptr_Tensor + 1);
            } while (pTVar9 != pTVar10);
          }
          pTVar6 = (Tensor<std::complex<double>_> *)((long)&pTVar6->_vptr_Tensor + 1);
        } while (pTVar6 != pTVar13);
      }
      scp::Tensor<double>::~Tensor((Tensor<double> *)&local_228);
      scp::Tensor<double>::~Tensor((Tensor<double> *)&local_288);
      local_228._vptr_Tensor = (_func_int **)pTVar13;
      scp::Tensor<double>::Tensor((Tensor<double> *)&local_288,1,(uint64_t *)&local_228);
      local_288._vptr_Tensor = (_func_int **)&PTR__Tensor_00110d38;
      local_258._vptr_Tensor = (_func_int **)pTVar13;
      scp::Tensor<double>::Tensor((Tensor<double> *)&local_228,1,(uint64_t *)&local_258);
      local_228._vptr_Tensor = (_func_int **)&PTR__Tensor_00110d38;
      if (local_298 != (Tensor<std::complex<double>_> *)0x0) {
        local_290 = (Tensor<std::complex<double>_> *)&pTVar13[-1].field_0x2f;
        pTVar9 = (Tensor<std::complex<double>_> *)0x0;
        do {
          if (pTVar13 != (Tensor<std::complex<double>_> *)0x0) {
            pTVar6 = (Tensor<std::complex<double>_> *)0x0;
            do {
              local_258._shape.order = 2;
              local_258._vptr_Tensor = (_func_int **)&local_1b8;
              local_1b8._vptr_Tensor = (_func_int **)pTVar6;
              local_1b8._shape.order = (uint64_t)pTVar9;
              pdVar5 = scp::Tensor<double>::operator[]
                                 (&local_90,(initializer_list<unsigned_long> *)&local_258);
              local_2c8 = (Tensor<std::complex<double>_> *)*pdVar5;
              local_2b8 = (anonymous_namespace)::
                          curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                          ::dtUsed;
              local_258._shape.order = 2;
              local_258._vptr_Tensor = (_func_int **)&local_1b8;
              local_1b8._vptr_Tensor = (_func_int **)pTVar6;
              local_1b8._shape.order = (uint64_t)pTVar9;
              pdVar5 = scp::Tensor<double>::operator[]
                                 ((Tensor<double> *)&local_150,
                                  (initializer_list<unsigned_long> *)&local_258);
              local_2a0 = (Tensor<std::complex<double>_> *)*pdVar5;
              pTVar10 = (Tensor<std::complex<double>_> *)((long)&pTVar6->_vptr_Tensor + 1);
              local_2d8._M_array = (iterator)(Tensor<std::complex<double>_> *)0x0;
              if (local_290 != pTVar6) {
                local_2d8._M_array = (iterator)pTVar10;
              }
              local_d8._shape.order = 2;
              local_2d8._M_len = (size_type)pTVar9;
              local_d8._vptr_Tensor = (_func_int **)&local_2d8;
              pdVar5 = scp::Tensor<double>::operator[]
                                 ((Tensor<double> *)&local_150,
                                  (initializer_list<unsigned_long> *)&local_d8);
              pTVar13 = local_1f8;
              if (local_288._length <= pTVar6) goto LAB_00107cb4;
              dVar15 = ((double)local_2c8 * (double)local_2b8) / local_118;
              *(double *)((local_288._values)->_M_value + (long)pTVar6 * 8) =
                   (dVar15 + -1.0) * dVar15 * 0.5 * *pdVar5 +
                   (1.0 - dVar15 * dVar15) * (double)local_2a0;
              pTVar8 = (Tensor<std::complex<double>_> *)
                       ((ulong)(&pTVar6[-1].field_0x2f + (long)&local_1f8->_vptr_Tensor) %
                       (ulong)local_1f8);
              local_258._shape.order = 2;
              local_258._vptr_Tensor = (_func_int **)&local_1b8;
              local_1b8._vptr_Tensor = (_func_int **)pTVar8;
              local_1b8._shape.order = (uint64_t)pTVar9;
              pdVar5 = scp::Tensor<double>::operator[]
                                 (&local_90,(initializer_list<unsigned_long> *)&local_258);
              local_2c8 = (Tensor<std::complex<double>_> *)*pdVar5;
              local_2b8 = (anonymous_namespace)::
                          curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                          ::dtUsed;
              local_258._vptr_Tensor = (_func_int **)&local_1b8;
              local_258._shape.order = 2;
              local_1b8._vptr_Tensor = (_func_int **)pTVar8;
              local_1b8._shape.order = (uint64_t)pTVar9;
              pdVar5 = scp::Tensor<double>::operator[]
                                 ((Tensor<double> *)&local_150,
                                  (initializer_list<unsigned_long> *)&local_258);
              if (local_288._length <= pTVar6) goto LAB_00107cb4;
              dVar15 = ((double)local_2c8 * (double)local_2b8) / local_118;
              *(double *)((local_288._values)->_M_value + (long)pTVar6 * 8) =
                   (dVar15 + 1.0) * dVar15 * 0.5 * *pdVar5 +
                   *(double *)((local_288._values)->_M_value + (long)pTVar6 * 8);
              pTVar6 = pTVar10;
            } while (pTVar13 != pTVar10);
          }
          scp::operator*((Vector<double> *)&local_258,
                         (Matrix<double> *)
                         (anonymous_namespace)::
                         curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                         ::Ky,(Vector<double> *)&local_288);
          scp::Tensor<double>::operator=((Tensor<double> *)&local_288,(Tensor<double> *)&local_258);
          scp::Tensor<double>::~Tensor((Tensor<double> *)&local_258);
          pTVar6 = local_298;
          if (pTVar13 != (Tensor<std::complex<double>_> *)0x0) {
            pTVar10 = (Tensor<std::complex<double>_> *)0x0;
            do {
              if (local_288._length <= pTVar10) goto LAB_00107cb4;
              local_2c8 = *(Tensor<std::complex<double>_> **)
                           ((local_288._values)->_M_value + (long)pTVar10 * 8);
              local_258._vptr_Tensor = (_func_int **)&local_1b8;
              local_258._shape.order = 2;
              local_1b8._vptr_Tensor = (_func_int **)pTVar10;
              local_1b8._shape.order = (uint64_t)pTVar9;
              pdVar5 = scp::Tensor<double>::operator[]
                                 ((Tensor<double> *)&local_150,
                                  (initializer_list<unsigned_long> *)&local_258);
              *pdVar5 = (double)local_2c8;
              pTVar10 = (Tensor<std::complex<double>_> *)((long)&pTVar10->_vptr_Tensor + 1);
            } while (pTVar13 != pTVar10);
          }
          pTVar9 = (Tensor<std::complex<double>_> *)((long)&pTVar9->_vptr_Tensor + 1);
        } while (pTVar9 != pTVar6);
      }
      scp::Tensor<double>::~Tensor((Tensor<double> *)&local_228);
      scp::Tensor<double>::~Tensor((Tensor<double> *)&local_288);
      local_2c8 = (anonymous_namespace)::
                  curl2D(scp::Matrix<double>&,scp::Matrix<double>const&,scp::Matrix<double>const&,double,double,double,double)
                  ::dtUsed;
      std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                ((path *)&local_288,local_120,auto_format);
      local_258._vptr_Tensor = (_func_int **)&local_150;
      std::thread::
      thread<void(&)(std::filesystem::__cxx11::path_const&,double,scp::Matrix<double>const&),std::filesystem::__cxx11::path,double&,std::reference_wrapper<scp::Matrix<double>>,void>
                ((thread *)&local_228,simanim::saveAnimationFrame,(path *)&local_288,&local_1c0,
                 (reference_wrapper<scp::Matrix<double>_> *)&local_258);
      if ((Tensor<std::complex<double>_> *)local_1e8._32_8_ != (Tensor<std::complex<double>_> *)0x0)
      goto LAB_00107e52;
      local_1e8._32_8_ = local_228._vptr_Tensor;
      local_228._vptr_Tensor = (_func_int **)0x0;
      std::filesystem::__cxx11::path::~path((path *)&local_288);
      local_1c0 = (double)local_2c8 + local_1c0;
    } while (local_1c0 < local_f8);
  }
  std::thread::join();
  if ((Tensor<std::complex<double>_> *)local_1e8._32_8_ == (Tensor<std::complex<double>_> *)0x0) {
    scp::Tensor<double>::~Tensor((Tensor<double> *)&local_150);
    scp::Tensor<double>::~Tensor(&local_90);
    scp::Tensor<double>::~Tensor(&local_60);
    return;
  }
LAB_00107e52:
  std::terminate();
LAB_00107ccb:
  __function = 
  "TValue &scp::Tensor<std::complex<double>>::operator[](uint64_t) [TValue = std::complex<double>]";
  goto LAB_00107ce0;
LAB_00107cb4:
  __function = "TValue &scp::Tensor<double>::operator[](uint64_t) [TValue = double]";
LAB_00107ce0:
  __assert_fail("index < _length",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Reiex[P]SciPP/include/SciPP/Core/templates/Tensor.hpp"
                ,0x310,__function);
}

Assistant:

void simuFluide2D(const std::string& name, uint64_t Nx, uint64_t Ny, double tSimu, double nu, double rho, double delta, double Lx, double Ly)
{
	double dx = Lx / Nx;
	double dy = Ly / Ny;
	double kappa = nu / rho;
	scp::Matrix<double> Ux(Ny, Nx, 0.0);
	scp::Matrix<double> Uy(Ny, Nx, 0.0);
	scp::Matrix<double> W(Ny, Nx);

	for (uint64_t i = 0, n = 0; i < Ny; ++i)
	{
		for (uint64_t j = 0; j < Nx; ++j, ++n)
		{
			W[n] = wInit((j + 0.5) / Nx, (i + 0.5) / Ny, delta, rho);
		}
	}

	double t(0), dtx, dty, dt;
	uint64_t iterations = 0;

	simanim::createAnimation(name, Nx, Ny);
	std::thread saveThread(simanim::saveAnimationFrame, fs::path(name), t, std::ref(W));
	while (t < tSimu)
	{
		iterations++;
		std::cout << "> Iteration " << iterations << " a t=" << t << std::endl;

		velocityFromCurl(W, Ux, Uy, Lx, Ly);

		dtx = dx / std::abs(*std::max_element(Ux.begin(), Ux.end(), [](double x, double y) { return std::abs(x) < std::abs(y); }));
		dty = dy / std::abs(*std::max_element(Uy.begin(), Uy.end(), [](double x, double y) { return std::abs(x) < std::abs(y); }));
		dt = std::min(dtx, dty);

		saveThread.join();
		dt = curl2D(W, Ux, Uy, kappa, dx, dy, dt);
		saveThread = std::thread(simanim::saveAnimationFrame, fs::path(name), t, std::ref(W));

		t += dt;
	}

	saveThread.join();
}